

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dj_algebra.h
# Opt level: O0

mat3 * dja::inverse(mat3 *__return_storage_ptr__,mat3 *m)

{
  float s;
  mat3 local_38;
  float_t local_14;
  mat3 *pmStack_10;
  float_t det;
  mat3 *m_local;
  
  pmStack_10 = m;
  local_14 = determinant(m);
  if ((local_14 == 0.0) && (!NAN(local_14))) {
    __assert_fail("det != float_t(0)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/dj_algebra/dj_algebra.h"
                  ,0x250,"mat3 dja::inverse(const mat3 &)");
  }
  s = 1.0 / local_14;
  adjugate(&local_38,pmStack_10);
  operator*(__return_storage_ptr__,s,&local_38);
  return __return_storage_ptr__;
}

Assistant:

mat3 inverse(const mat3& m)
{
    float_t det = determinant(m);
    DJA_ASSERT(det != float_t(0));

    return (float_t(1) / det) * adjugate(m);
}